

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O2

bool miniros::xml_cast<bool>(RpcValue *xml_value)

{
  Type TVar1;
  byte bVar2;
  double *pdVar3;
  int *piVar4;
  bool *pbVar5;
  
  TVar1 = xml_value->_type;
  if (TVar1 == TypeBoolean) {
    pbVar5 = XmlRpc::XmlRpcValue::operator_cast_to_bool_(xml_value);
    bVar2 = *pbVar5;
  }
  else if (TVar1 == TypeInt) {
    piVar4 = XmlRpc::XmlRpcValue::operator_cast_to_int_(xml_value);
    bVar2 = *piVar4 != 0;
  }
  else if (TVar1 == TypeDouble) {
    pdVar3 = XmlRpc::XmlRpcValue::operator_cast_to_double_(xml_value);
    bVar2 = -(*pdVar3 != 0.0) & 1;
  }
  else {
    bVar2 = 0;
  }
  return (bool)bVar2;
}

Assistant:

bool xml_cast(MasterLink::RpcValue xml_value)
{
  using namespace XmlRpc;
  switch (xml_value.getType()) {
    case XmlRpcValue::TypeDouble:
      return static_cast<bool>(static_cast<double>(xml_value));
    case XmlRpcValue::TypeInt:
      return static_cast<bool>(static_cast<int>(xml_value));
    case XmlRpcValue::TypeBoolean:
      return static_cast<bool>(xml_value);
    default:
      return false;
  };
}